

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromFrequencies
               (HuffmanTree *tree,uint *frequencies,size_t mincodes,size_t numcodes,uint maxbitlen)

{
  size_t __size;
  long lVar1;
  uint uVar2;
  long lVar3;
  uint *lengths;
  size_t sVar4;
  long lVar5;
  
  lVar5 = 1;
  lVar3 = 0;
  sVar4 = numcodes * 4 + 4;
  do {
    __size = sVar4 - 4;
    lVar5 = lVar5 + -1;
    if (numcodes + lVar3 <= mincodes) break;
    lVar3 = lVar3 + -1;
    lVar1 = sVar4 - 8;
    sVar4 = __size;
  } while (*(int *)((long)frequencies + lVar1) == 0);
  lengths = (uint *)malloc(__size);
  tree->lengths = lengths;
  if (lengths == (uint *)0x0) {
    uVar2 = 0x53;
  }
  else {
    tree->maxbitlen = maxbitlen;
    tree->numcodes = (int)numcodes + (int)lVar5;
    uVar2 = lodepng_huffman_code_lengths(lengths,frequencies,numcodes + lVar5,maxbitlen);
    if (uVar2 == 0) {
      uVar2 = HuffmanTree_makeFromLengths2(tree);
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

static unsigned HuffmanTree_makeFromFrequencies(HuffmanTree* tree, const unsigned* frequencies,
                                                size_t mincodes, size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  while(!frequencies[numcodes - 1] && numcodes > mincodes) --numcodes; /*trim zeroes*/
  tree->lengths = (unsigned*)lodepng_malloc(numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/

  error = lodepng_huffman_code_lengths(tree->lengths, frequencies, numcodes, maxbitlen);
  if(!error) error = HuffmanTree_makeFromLengths2(tree);
  return error;
}